

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O3

void __thiscall luabridge::Namespace::Namespace(Namespace *this,char *name,Namespace *parent)

{
  int *piVar1;
  lua_State *plVar2;
  int iVar3;
  
  plVar2 = (parent->super_Registrar).L;
  (this->super_Registrar).L = plVar2;
  (this->super_Registrar).m_stackSize = (parent->super_Registrar).m_stackSize;
  (parent->super_Registrar).m_stackSize = 0;
  iVar3 = lua_type(plVar2,-1);
  if (iVar3 != 5) {
    __assert_fail("lua_istable(L, -1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                  ,0x3f8,"luabridge::Namespace::Namespace(const char *, Namespace &)");
  }
  plVar2 = (this->super_Registrar).L;
  iVar3 = lua_type(plVar2,-1);
  if (iVar3 != 5) {
    __assert_fail("lua_istable(L, index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/LuaHelpers.h"
                  ,0x5a,"void luabridge::rawgetfield(lua_State *, int, const char *)");
  }
  iVar3 = lua_absindex(plVar2,-1);
  lua_pushstring(plVar2,name);
  lua_rawget(plVar2,iVar3);
  iVar3 = lua_type((this->super_Registrar).L,-1);
  if (iVar3 == 0) {
    lua_settop((this->super_Registrar).L,-2);
    lua_createtable((this->super_Registrar).L,0,0);
    lua_pushvalue((this->super_Registrar).L,-1);
    lua_setmetatable((this->super_Registrar).L,-2);
    lua_pushcclosure((this->super_Registrar).L,detail::CFunc::indexMetaMethod,0);
    plVar2 = (this->super_Registrar).L;
    iVar3 = lua_type(plVar2,-2);
    if (iVar3 == 5) {
      iVar3 = lua_absindex(plVar2,-2);
      lua_pushstring(plVar2,"__index");
      lua_rotate(plVar2,-2,1);
      lua_rawset(plVar2,iVar3);
      lua_pushcclosure((this->super_Registrar).L,detail::CFunc::newindexStaticMetaMethod,0);
      plVar2 = (this->super_Registrar).L;
      iVar3 = lua_type(plVar2,-2);
      if (iVar3 == 5) {
        iVar3 = lua_absindex(plVar2,-2);
        lua_pushstring(plVar2,"__newindex");
        lua_rotate(plVar2,-2,1);
        lua_rawset(plVar2,iVar3);
        lua_createtable((this->super_Registrar).L,0,0);
        lua_rawsetp((this->super_Registrar).L,-2,(void *)0x6e7);
        lua_createtable((this->super_Registrar).L,0,0);
        lua_rawsetp((this->super_Registrar).L,-2,(void *)0x5e7);
        lua_pushvalue((this->super_Registrar).L,-1);
        plVar2 = (this->super_Registrar).L;
        iVar3 = lua_type(plVar2,-3);
        if (iVar3 == 5) {
          iVar3 = lua_absindex(plVar2,-3);
          lua_pushstring(plVar2,name);
          lua_rotate(plVar2,-2,1);
          lua_rawset(plVar2,iVar3);
          goto LAB_0011eaf4;
        }
      }
    }
    __assert_fail("lua_istable(L, index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/LuaHelpers.h"
                  ,100,"void luabridge::rawsetfield(lua_State *, int, const char *)");
  }
LAB_0011eaf4:
  piVar1 = &(this->super_Registrar).m_stackSize;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

Namespace(char const* name, Namespace& parent) : Registrar(parent)
    {
        assert(lua_istable(L, -1)); // Stack: parent namespace (pns)

        rawgetfield(L, -1, name); // Stack: pns, namespace (ns) | nil

        if (lua_isnil(L, -1)) // Stack: pns, nil
        {
            lua_pop(L, 1); // Stack: pns

            lua_newtable(L); // Stack: pns, ns
            lua_pushvalue(L, -1); // Stack: pns, ns, ns

            // na.__metatable = ns
            lua_setmetatable(L, -2); // Stack: pns, ns

            // ns.__index = indexMetaMethod
            lua_pushcfunction(L, &CFunc::indexMetaMethod);
            rawsetfield(L, -2, "__index"); // Stack: pns, ns

            // ns.__newindex = newindexMetaMethod
            lua_pushcfunction(L, &CFunc::newindexStaticMetaMethod);
            rawsetfield(L, -2, "__newindex"); // Stack: pns, ns

            lua_newtable(L); // Stack: pns, ns, propget table (pg)
            lua_rawsetp(L, -2, detail::getPropgetKey()); // ns [propgetKey] = pg. Stack: pns, ns

            lua_newtable(L); // Stack: pns, ns, propset table (ps)
            lua_rawsetp(L, -2, detail::getPropsetKey()); // ns [propsetKey] = ps. Stack: pns, ns

            // pns [name] = ns
            lua_pushvalue(L, -1); // Stack: pns, ns, ns
            rawsetfield(L, -3, name); // Stack: pns, ns
#if 0
      lua_pushcfunction (L, &tostringMetaMethod);
      rawsetfield (L, -2, "__tostring");
#endif
        }

        ++m_stackSize;
    }